

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiMetricsConfig *p_open_00;
  bool *pbVar1;
  int *piVar2;
  ImVector<unsigned_int> *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiWindow **ppIVar6;
  ImGuiViewportP *pIVar7;
  ImGuiPopupData *pIVar8;
  undefined8 *puVar9;
  ImFontAtlas *atlas;
  int iVar10;
  undefined1 auVar11 [16];
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  int iVar15;
  bool bVar14;
  ImGuiContext *g;
  ImDrawList *pIVar16;
  ImGuiWindow **ppIVar17;
  ImU32 col;
  ImGuiContext *g_6;
  long lVar18;
  long lVar19;
  ImGuiWindow *pIVar20;
  char *pcVar21;
  long lVar22;
  char *pcVar23;
  int rect_n;
  ImGuiTable *pIVar24;
  ImGuiTableSettings *settings;
  bool bVar25;
  undefined **ppuVar26;
  char **ppcVar27;
  ImGuiWindow **ppIVar28;
  int rect_n_1;
  ulong uVar29;
  ImVector<ImDrawList_*> *pIVar30;
  uint uVar31;
  int iVar32;
  ImGuiContext *g_7;
  ulong uVar33;
  ImGuiTabBar *pIVar34;
  uint *puVar35;
  ImGuiWindow *window;
  byte bVar36;
  float fVar37;
  float fVar38;
  float extraout_XMM0_Db;
  float fVar39;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar40;
  undefined4 uVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ImRect IVar45;
  ImVec2 local_1b8;
  int *local_1b0;
  undefined1 local_1a8 [16];
  int *local_198;
  ImVec2 local_190;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  char buf [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  pIVar12 = GImGui;
  bVar36 = 0;
  p_open_00 = &GImGui->DebugMetricsConfig;
  if ((GImGui->DebugMetricsConfig).ShowStackTool == true) {
    ShowStackToolWindow(&p_open_00->ShowStackTool);
  }
  bVar14 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  if ((bVar14) &&
     (pIVar20 = GImGui->CurrentWindow, pIVar20->WriteAccessed = true, pIVar20->BeginCount < 2)) {
    Text("Dear ImGui %s","1.88 WIP");
    uVar40 = 0;
    uVar41 = 0;
    Text("Application average %.3f ms/frame (%.1f FPS)",
         SUB84((double)(1000.0 / (pIVar12->IO).Framerate),0));
    iVar15 = (pIVar12->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar12->IO).MetricsRenderVertices,
         (long)iVar15,(ulong)(uint)(iVar15 / 3));
    Text("%d visible windows, %d active allocations",(ulong)(uint)(pIVar12->IO).MetricsRenderWindows
         ,(ulong)(uint)(pIVar12->IO).MetricsActiveAllocations);
    Separator();
    wrt_rects_names[6] = "ContentIdeal";
    wrt_rects_names[7] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    ppuVar26 = &PTR_anon_var_dwarf_344c7_0017a9d0;
    ppcVar27 = trt_rects_names;
    for (lVar18 = 0xd; lVar18 != 0; lVar18 = lVar18 + -1) {
      *ppcVar27 = *ppuVar26;
      ppuVar26 = ppuVar26 + (ulong)bVar36 * -2 + 1;
      ppcVar27 = ppcVar27 + (ulong)bVar36 * -2 + 1;
    }
    local_198 = &(pIVar12->DebugMetricsConfig).ShowWindowsRectsType;
    if ((pIVar12->DebugMetricsConfig).ShowWindowsRectsType < 0) {
      *local_198 = 4;
    }
    local_1b0 = &(pIVar12->DebugMetricsConfig).ShowTablesRectsType;
    if ((pIVar12->DebugMetricsConfig).ShowTablesRectsType < 0) {
      *local_1b0 = 2;
    }
    bVar14 = TreeNode("Tools");
    if (bVar14) {
      Checkbox("Show stack tool",&p_open_00->ShowStackTool);
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      if (pIVar20->SkipItems == false) {
        (pIVar20->DC).CursorPos.x =
             (pIVar13->Style).ItemSpacing.x + (pIVar20->DC).CursorPosPrevLine.x;
        (pIVar20->DC).CursorPos.y = (pIVar20->DC).CursorPosPrevLine.y;
        (pIVar20->DC).CurrLineSize = (pIVar20->DC).PrevLineSize;
        (pIVar20->DC).CurrLineTextBaseOffset = (pIVar20->DC).PrevLineTextBaseOffset;
      }
      MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");
      Checkbox("Show windows begin order",&(pIVar12->DebugMetricsConfig).ShowWindowsBeginOrder);
      pbVar1 = &(pIVar12->DebugMetricsConfig).ShowWindowsRects;
      Checkbox("Show windows rectangles",pbVar1);
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      if (pIVar20->SkipItems == false) {
        (pIVar20->DC).CursorPos.x =
             (pIVar13->Style).ItemSpacing.x + (pIVar20->DC).CursorPosPrevLine.x;
        (pIVar20->DC).CursorPos.y = (pIVar20->DC).CursorPosPrevLine.y;
        (pIVar20->DC).CurrLineSize = (pIVar20->DC).PrevLineSize;
        (pIVar20->DC).CurrLineTextBaseOffset = (pIVar20->DC).PrevLineTextBaseOffset;
      }
      fVar37 = pIVar13->FontSize;
      *(byte *)&(pIVar13->NextItemData).Flags = (byte)(pIVar13->NextItemData).Flags | 1;
      (pIVar13->NextItemData).Width = fVar37 * 12.0;
      bVar14 = Combo("##show_windows_rect_type",local_198,wrt_rects_names,8,8);
      *pbVar1 = (bool)(*pbVar1 | bVar14);
      if ((*pbVar1 != false) && (pIVar12->NavWindow != (ImGuiWindow *)0x0)) {
        lVar18 = 0;
        BulletText("\'%s\':",pIVar12->NavWindow->Name);
        pIVar13 = GImGui;
        pIVar20 = GImGui->CurrentWindow;
        pIVar20->WriteAccessed = true;
        fVar37 = (pIVar13->Style).IndentSpacing + (pIVar20->DC).Indent.x;
        (pIVar20->DC).Indent.x = fVar37;
        (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
        do {
          IVar45 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar12->NavWindow,(int)lVar18);
          uVar40 = 0;
          uVar41 = 0;
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar45.Min.x,0),
               SUB84((double)IVar45.Min.y,0),SUB84((double)IVar45.Max.x,0),(double)IVar45.Max.y,
               (double)(IVar45.Max.x - IVar45.Min.x),(double)(IVar45.Max.y - IVar45.Min.y),
               wrt_rects_names[lVar18]);
          pIVar13 = GImGui;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 8);
        pIVar20 = GImGui->CurrentWindow;
        pIVar20->WriteAccessed = true;
        fVar37 = (pIVar20->DC).Indent.x - (pIVar13->Style).IndentSpacing;
        (pIVar20->DC).Indent.x = fVar37;
        (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      }
      pbVar1 = &(pIVar12->DebugMetricsConfig).ShowTablesRects;
      Checkbox("Show tables rectangles",pbVar1);
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      if (pIVar20->SkipItems == false) {
        (pIVar20->DC).CursorPos.x =
             (pIVar13->Style).ItemSpacing.x + (pIVar20->DC).CursorPosPrevLine.x;
        (pIVar20->DC).CursorPos.y = (pIVar20->DC).CursorPosPrevLine.y;
        (pIVar20->DC).CurrLineSize = (pIVar20->DC).PrevLineSize;
        (pIVar20->DC).CurrLineTextBaseOffset = (pIVar20->DC).PrevLineTextBaseOffset;
      }
      fVar37 = pIVar13->FontSize;
      *(byte *)&(pIVar13->NextItemData).Flags = (byte)(pIVar13->NextItemData).Flags | 1;
      (pIVar13->NextItemData).Width = fVar37 * 12.0;
      bVar14 = Combo("##show_table_rects_type",local_1b0,trt_rects_names,0xd,0xd);
      *pbVar1 = (bool)(*pbVar1 | bVar14);
      if (((*pbVar1 != false) && (pIVar12->NavWindow != (ImGuiWindow *)0x0)) &&
         (iVar15 = (pIVar12->Tables).Map.Data.Size, 0 < iVar15)) {
        lVar18 = 0;
        do {
          pIVar24 = (pIVar12->Tables).Buf.Data;
          lVar19 = (long)(pIVar12->Tables).Map.Data.Data[lVar18].field_1.val_i;
          if ((pIVar24 != (ImGuiTable *)0x0 && lVar19 != -1) &&
             (pIVar24 = pIVar24 + lVar19, pIVar12->FrameCount + -1 <= pIVar24->LastFrameActive)) {
            if ((pIVar24->OuterWindow == pIVar12->NavWindow) ||
               (pIVar24->InnerWindow == pIVar12->NavWindow)) {
              local_178._0_8_ = lVar18;
              BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar24->ID,
                         (ulong)(uint)pIVar24->ColumnsCount,pIVar24->OuterWindow->Name);
              bVar14 = IsItemHovered(0);
              if (bVar14) {
                pIVar16 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                auVar11 = buf._0_16_;
                IVar4 = (pIVar24->OuterRect).Min;
                buf._4_4_ = IVar4.y + -1.0;
                buf._0_4_ = IVar4.x + -1.0;
                buf._8_8_ = auVar11._8_8_;
                IVar4 = (pIVar24->OuterRect).Max;
                local_1b8.y = IVar4.y + 1.0;
                local_1b8.x = IVar4.x + 1.0;
                uVar40 = 0;
                uVar41 = 0;
                ImDrawList::AddRect(pIVar16,(ImVec2 *)buf,&local_1b8,0xff00ffff,0.0,0,2.0);
              }
              pIVar13 = GImGui;
              pIVar20 = GImGui->CurrentWindow;
              pIVar20->WriteAccessed = true;
              fVar37 = (pIVar13->Style).IndentSpacing + (pIVar20->DC).Indent.x;
              (pIVar20->DC).Indent.x = fVar37;
              (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
              uVar29 = 0;
              do {
                iVar15 = (int)uVar29;
                if (uVar29 < 6) {
                  IVar45 = ShowMetricsWindow::Funcs::GetTableRect(pIVar24,iVar15,-1);
                  local_1a8._0_8_ = IVar45.Max;
                  local_1a8._8_4_ = uVar40;
                  local_1a8._12_4_ = uVar41;
                  uVar40 = 0;
                  uVar41 = 0;
                  fStack_180 = (float)extraout_XMM0_Dc_00;
                  local_188._0_4_ = IVar45.Min.x;
                  local_188._4_4_ = IVar45.Min.y;
                  fStack_17c = (float)extraout_XMM0_Dd_00;
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                                 SUB84((double)IVar45.Min.x,0),SUB84((double)IVar45.Min.y,0),
                                 SUB84((double)IVar45.Max.x,0),(double)IVar45.Max.y,
                                 (double)(IVar45.Max.x - IVar45.Min.x),
                                 (double)(IVar45.Max.y - IVar45.Min.y),trt_rects_names[uVar29]);
                  local_1b8.x = 0.0;
                  local_1b8.y = 0.0;
                  Selectable(buf,false,0,&local_1b8);
                  bVar14 = IsItemHovered(0);
                  if (bVar14) {
                    pIVar16 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                    local_1b8.y = (float)local_188._4_4_ + -1.0;
                    local_1b8.x = (float)local_188._0_4_ + -1.0;
                    local_190.y = (float)local_1a8._4_4_ + 1.0;
                    local_190.x = (float)local_1a8._0_4_ + 1.0;
                    uVar40 = 0;
                    uVar41 = 0;
                    ImDrawList::AddRect(pIVar16,&local_1b8,&local_190,0xff00ffff,0.0,0,2.0);
                  }
                }
                else if (((iVar15 == 8) || (iVar15 == 6)) && (0 < pIVar24->ColumnsCount)) {
                  uVar33 = 0;
                  do {
                    IVar45 = ShowMetricsWindow::Funcs::GetTableRect(pIVar24,iVar15,(int)uVar33);
                    local_1a8._0_8_ = IVar45.Max;
                    local_1a8._8_4_ = uVar40;
                    local_1a8._12_4_ = uVar41;
                    uVar40 = 0;
                    uVar41 = 0;
                    fStack_180 = (float)extraout_XMM0_Dc;
                    local_188._0_4_ = IVar45.Min.x;
                    local_188._4_4_ = IVar45.Min.y;
                    fStack_17c = (float)extraout_XMM0_Dd;
                    ImFormatString(buf,0x80,
                                   "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                   SUB84((double)IVar45.Min.x,0),SUB84((double)IVar45.Min.y,0),
                                   SUB84((double)IVar45.Max.x,0),(double)IVar45.Max.y,
                                   (double)(IVar45.Max.x - IVar45.Min.x),
                                   (double)(IVar45.Max.y - IVar45.Min.y),uVar33);
                    local_1b8.x = 0.0;
                    local_1b8.y = 0.0;
                    Selectable(buf,false,0,&local_1b8);
                    bVar14 = IsItemHovered(0);
                    if (bVar14) {
                      pIVar16 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                      local_1b8.y = (float)local_188._4_4_ + -1.0;
                      local_1b8.x = (float)local_188._0_4_ + -1.0;
                      local_190.y = (float)local_1a8._4_4_ + 1.0;
                      local_190.x = (float)local_1a8._0_4_ + 1.0;
                      uVar40 = 0;
                      uVar41 = 0;
                      ImDrawList::AddRect(pIVar16,&local_1b8,&local_190,0xff00ffff,0.0,0,2.0);
                    }
                    uVar31 = (int)uVar33 + 1;
                    uVar33 = (ulong)uVar31;
                  } while ((int)uVar31 < pIVar24->ColumnsCount);
                }
                pIVar13 = GImGui;
                uVar29 = uVar29 + 1;
              } while (uVar29 != 0xd);
              pIVar20 = GImGui->CurrentWindow;
              pIVar20->WriteAccessed = true;
              fVar37 = (pIVar20->DC).Indent.x - (pIVar13->Style).IndentSpacing;
              (pIVar20->DC).Indent.x = fVar37;
              (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
              iVar15 = (pIVar12->Tables).Map.Data.Size;
              lVar18 = local_178._0_8_;
            }
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < iVar15);
      }
      auVar11._8_8_ = 0;
      auVar11[0] = buf[8];
      auVar11[1] = buf[9];
      auVar11[2] = buf[10];
      auVar11[3] = buf[0xb];
      auVar11[4] = buf[0xc];
      auVar11[5] = buf[0xd];
      auVar11[6] = buf[0xe];
      auVar11[7] = buf[0xf];
      buf._0_16_ = auVar11 << 0x40;
      bVar14 = Button("Item Picker..",(ImVec2 *)buf);
      pIVar13 = GImGui;
      if (bVar14) {
        GImGui->DebugItemPickerActive = true;
      }
      pIVar20 = pIVar13->CurrentWindow;
      pIVar20->WriteAccessed = true;
      if (pIVar20->SkipItems == false) {
        (pIVar20->DC).CursorPos.x =
             (pIVar13->Style).ItemSpacing.x + (pIVar20->DC).CursorPosPrevLine.x;
        (pIVar20->DC).CursorPos.y = (pIVar20->DC).CursorPosPrevLine.y;
        (pIVar20->DC).CurrLineSize = (pIVar20->DC).PrevLineSize;
        (pIVar20->DC).CurrLineTextBaseOffset = (pIVar20->DC).PrevLineTextBaseOffset;
      }
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      TreePop();
    }
    local_1a8._0_8_ = &pIVar12->Windows;
    uVar29 = 0;
    bVar14 = TreeNode("Windows","Windows (%d)",(ulong)(uint)(pIVar12->Windows).Size);
    if (bVar14) {
      DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)local_1a8._0_8_,"By display order");
      DebugNodeWindowsList(&pIVar12->WindowsFocusOrder,"By focus order (root windows)");
      bVar14 = TreeNode("By submission order (begin stack)");
      if (bVar14) {
        if ((pIVar12->WindowsTempSortBuffer).Capacity < 0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar2 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + 1;
          }
          ppIVar17 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
          ppIVar28 = (pIVar12->WindowsTempSortBuffer).Data;
          if (ppIVar28 != (ImGuiWindow **)0x0) {
            memcpy(ppIVar17,ppIVar28,(long)(pIVar12->WindowsTempSortBuffer).Size << 3);
            ppIVar28 = (pIVar12->WindowsTempSortBuffer).Data;
            if ((ppIVar28 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar2 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar28,GImAllocatorUserData);
          }
          (pIVar12->WindowsTempSortBuffer).Data = ppIVar17;
          (pIVar12->WindowsTempSortBuffer).Capacity = 0;
        }
        (pIVar12->WindowsTempSortBuffer).Size = 0;
        iVar15 = (pIVar12->Windows).Size;
        if (iVar15 < 1) {
          ppIVar28 = (pIVar12->WindowsTempSortBuffer).Data;
          uVar31 = 0;
        }
        else {
          uVar33 = 0;
          lVar18 = 0;
          do {
            iVar32 = (int)uVar33;
            ppIVar28 = (pIVar12->Windows).Data;
            pIVar20 = ppIVar28[lVar18];
            if (pIVar12->FrameCount <= pIVar20->LastFrameActive + 1) {
              if (iVar32 == (pIVar12->WindowsTempSortBuffer).Capacity) {
                if (iVar32 == 0) {
                  iVar15 = 8;
                }
                else {
                  iVar15 = ((int)(uVar33 >> 0x1f) + iVar32 >> 1) + iVar32;
                }
                iVar10 = iVar32 + 1;
                if (iVar32 + 1 < iVar15) {
                  iVar10 = iVar15;
                }
                if (GImGui != (ImGuiContext *)0x0) {
                  piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar2 = *piVar2 + 1;
                }
                ppIVar17 = (ImGuiWindow **)
                           (*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
                ppIVar6 = (pIVar12->WindowsTempSortBuffer).Data;
                if (ppIVar6 != (ImGuiWindow **)0x0) {
                  memcpy(ppIVar17,ppIVar6,(long)(pIVar12->WindowsTempSortBuffer).Size << 3);
                  ppIVar6 = (pIVar12->WindowsTempSortBuffer).Data;
                  if ((ppIVar6 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar2 = *piVar2 + -1;
                  }
                  (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
                }
                (pIVar12->WindowsTempSortBuffer).Data = ppIVar17;
                (pIVar12->WindowsTempSortBuffer).Capacity = iVar10;
                iVar32 = (pIVar12->WindowsTempSortBuffer).Size;
                pIVar20 = ppIVar28[lVar18];
              }
              else {
                ppIVar17 = (pIVar12->WindowsTempSortBuffer).Data;
              }
              ppIVar17[iVar32] = pIVar20;
              iVar15 = (pIVar12->Windows).Size;
              uVar31 = (pIVar12->WindowsTempSortBuffer).Size + 1;
              uVar33 = (ulong)uVar31;
              (pIVar12->WindowsTempSortBuffer).Size = uVar31;
            }
            uVar31 = (uint)uVar33;
            lVar18 = lVar18 + 1;
          } while (lVar18 < iVar15);
          ppIVar28 = (pIVar12->WindowsTempSortBuffer).Data;
          if (1 < uVar31) {
            qsort(ppIVar28,(long)(int)uVar31,8,ShowMetricsWindow::Func::WindowComparerByBeginOrder);
            ppIVar28 = (pIVar12->WindowsTempSortBuffer).Data;
            uVar31 = (pIVar12->WindowsTempSortBuffer).Size;
          }
        }
        DebugNodeWindowsListByBeginStackParent(ppIVar28,uVar31,(ImGuiWindow *)0x0);
        TreePop();
      }
      TreePop();
    }
    lVar18 = (long)(pIVar12->Viewports).Size;
    if (0 < lVar18) {
      lVar19 = 0;
      uVar29 = 0;
      do {
        pIVar7 = (pIVar12->Viewports).Data[lVar19];
        uVar29 = (ulong)(uint)((int)uVar29 + (pIVar7->DrawDataBuilder).Layers[0].Size +
                              (pIVar7->DrawDataBuilder).Layers[1].Size);
        lVar19 = lVar19 + 1;
      } while (lVar18 != lVar19);
    }
    bVar14 = TreeNode("DrawLists","DrawLists (%d)",uVar29);
    if (bVar14) {
      Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar12->DebugMetricsConfig).ShowDrawCmdMesh);
      Checkbox("Show ImDrawCmd bounding boxes when hovering",
               &(pIVar12->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
      if (0 < (pIVar12->Viewports).Size) {
        lVar18 = 0;
        do {
          pIVar7 = (pIVar12->Viewports).Data[lVar18];
          lVar19 = 0;
          bVar14 = true;
          do {
            bVar25 = bVar14;
            if (0 < (pIVar7->DrawDataBuilder).Layers[lVar19].Size) {
              pIVar30 = (pIVar7->DrawDataBuilder).Layers + lVar19;
              lVar19 = 0;
              do {
                DebugNodeDrawList((ImGuiWindow *)0x0,pIVar30->Data[lVar19],"DrawList");
                lVar19 = lVar19 + 1;
              } while (lVar19 < pIVar30->Size);
            }
            lVar19 = 1;
            bVar14 = false;
          } while (bVar25);
          lVar18 = lVar18 + 1;
        } while (lVar18 < (pIVar12->Viewports).Size);
      }
      TreePop();
    }
    bVar14 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar12->Viewports).Size);
    if (bVar14) {
      fVar37 = GetTreeNodeToLabelSpacing();
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      fVar42 = extraout_XMM0_Db;
      if ((fVar37 == 0.0) && (!NAN(fVar37))) {
        fVar37 = (pIVar13->Style).IndentSpacing;
        fVar42 = 0.0;
      }
      fVar37 = fVar37 + (pIVar20->DC).Indent.x;
      (pIVar20->DC).Indent.x = fVar37;
      fVar37 = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      (pIVar20->DC).CursorPos.x = fVar37;
      lVar18 = (long)(pIVar13->Viewports).Size;
      if (lVar18 < 1) {
        buf._0_4_ = -INFINITY;
        buf._4_4_ = -INFINITY;
      }
      else {
        lVar19 = 0;
        local_178 = _DAT_0015f560;
        local_168 = _DAT_0015f4c0;
        do {
          pIVar7 = (pIVar13->Viewports).Data[lVar19];
          IVar4 = (pIVar7->super_ImGuiViewport).Pos;
          auVar44._8_8_ = 0;
          auVar44._0_4_ = IVar4.x;
          auVar44._4_4_ = IVar4.y;
          IVar5 = (pIVar7->super_ImGuiViewport).Size;
          auVar43._0_4_ = IVar5.x + IVar4.x;
          auVar43._4_4_ = IVar5.y + IVar4.y;
          auVar43._8_8_ = 0;
          local_178 = maxps(auVar43,local_178);
          local_168 = minps(auVar44,local_168);
          lVar19 = lVar19 + 1;
        } while (lVar18 != lVar19);
        local_188._0_4_ = fVar37 + local_168._0_4_ * -0.125;
        local_188._4_4_ = (pIVar20->DC).CursorPos.y + local_168._4_4_ * -0.125;
        lVar18 = 0;
        fStack_180 = fVar42 + local_168._8_4_ * 0.0;
        fStack_17c = local_168._12_4_ * 0.0 + 0.0;
        fVar37 = (float)local_188._0_4_;
        fVar42 = (float)local_188._4_4_;
        do {
          pIVar7 = (pIVar13->Viewports).Data[lVar18];
          IVar4 = (pIVar7->super_ImGuiViewport).Pos;
          fVar38 = IVar4.x;
          fVar39 = IVar4.y;
          IVar4 = (pIVar7->super_ImGuiViewport).Size;
          buf._4_4_ = fVar39 * 0.125 + fVar42;
          buf._0_4_ = fVar38 * 0.125 + fVar37;
          buf._8_4_ = (IVar4.x + fVar38) * 0.125 + fVar37;
          buf._12_4_ = (IVar4.y + fVar39) * 0.125 + fVar42;
          DebugRenderViewportThumbnail(pIVar20->DrawList,pIVar7,(ImRect *)buf);
          lVar18 = lVar18 + 1;
          fVar37 = (float)local_188._0_4_;
          fVar42 = (float)local_188._4_4_;
        } while (lVar18 < (pIVar13->Viewports).Size);
        buf._0_4_ = ((float)local_178._0_4_ - (float)local_168._0_4_) * 0.125;
        buf._4_4_ = ((float)local_178._4_4_ - (float)local_168._4_4_) * 0.125;
      }
      Dummy((ImVec2 *)buf);
      fVar37 = GetTreeNodeToLabelSpacing();
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      if ((fVar37 == 0.0) && (!NAN(fVar37))) {
        fVar37 = (pIVar13->Style).IndentSpacing;
      }
      fVar37 = (pIVar20->DC).Indent.x - fVar37;
      (pIVar20->DC).Indent.x = fVar37;
      (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      if (0 < (pIVar12->Viewports).Size) {
        lVar18 = 0;
        do {
          DebugNodeViewport((pIVar12->Viewports).Data[lVar18]);
          lVar18 = lVar18 + 1;
        } while (lVar18 < (pIVar12->Viewports).Size);
      }
      TreePop();
    }
    bVar14 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar12->OpenPopupStack).Size);
    if (bVar14) {
      if (0 < (pIVar12->OpenPopupStack).Size) {
        lVar19 = 8;
        lVar18 = 0;
        do {
          pIVar8 = (pIVar12->OpenPopupStack).Data;
          puVar9 = *(undefined8 **)((long)&pIVar8->PopupId + lVar19);
          pcVar21 = "";
          pcVar23 = "NULL";
          if (puVar9 != (undefined8 *)0x0) {
            pcVar23 = (char *)*puVar9;
            pcVar21 = " ChildWindow";
            if ((*(uint *)((long)puVar9 + 0xc) >> 0x18 & 1) == 0) {
              pcVar21 = "";
            }
          }
          BulletText("PopupID: %08x, Window: \'%s\'%s%s",
                     (ulong)*(uint *)((long)pIVar8 + lVar19 + -8),pcVar23,pcVar21);
          lVar18 = lVar18 + 1;
          lVar19 = lVar19 + 0x30;
        } while (lVar18 < (pIVar12->OpenPopupStack).Size);
      }
      TreePop();
    }
    bVar14 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar12->TabBars).AliveCount);
    if (bVar14) {
      iVar15 = (pIVar12->TabBars).Map.Data.Size;
      if (0 < iVar15) {
        lVar19 = 8;
        lVar18 = 0;
        do {
          pIVar34 = (pIVar12->TabBars).Buf.Data;
          lVar22 = (long)*(int *)((long)&((pIVar12->TabBars).Map.Data.Data)->key + lVar19);
          if (pIVar34 != (ImGuiTabBar *)0x0 && lVar22 != -1) {
            pIVar34 = pIVar34 + lVar22;
            PushID(pIVar34);
            DebugNodeTabBar(pIVar34,"TabBar");
            pIVar3 = &GImGui->CurrentWindow->IDStack;
            pIVar3->Size = pIVar3->Size + -1;
            iVar15 = (pIVar12->TabBars).Map.Data.Size;
          }
          lVar18 = lVar18 + 1;
          lVar19 = lVar19 + 0x10;
        } while (lVar18 < iVar15);
      }
      TreePop();
    }
    bVar14 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar12->Tables).AliveCount);
    if (bVar14) {
      iVar15 = (pIVar12->Tables).Map.Data.Size;
      if (0 < iVar15) {
        lVar18 = 8;
        lVar19 = 0;
        do {
          pIVar24 = (pIVar12->Tables).Buf.Data;
          lVar22 = (long)*(int *)((long)&((pIVar12->Tables).Map.Data.Data)->key + lVar18);
          if (pIVar24 != (ImGuiTable *)0x0 && lVar22 != -1) {
            DebugNodeTable(pIVar24 + lVar22);
            iVar15 = (pIVar12->Tables).Map.Data.Size;
          }
          lVar19 = lVar19 + 1;
          lVar18 = lVar18 + 0x10;
        } while (lVar19 < iVar15);
      }
      TreePop();
    }
    atlas = (pIVar12->IO).Fonts;
    bVar14 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas->Fonts).Size);
    if (bVar14) {
      ShowFontAtlas(atlas);
      TreePop();
    }
    bVar14 = TreeNode("Settings");
    if (bVar14) {
      bVar14 = SmallButton("Clear");
      if (bVar14) {
        ClearIniSettings();
      }
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      if (pIVar20->SkipItems == false) {
        (pIVar20->DC).CursorPos.x =
             (pIVar13->Style).ItemSpacing.x + (pIVar20->DC).CursorPosPrevLine.x;
        (pIVar20->DC).CursorPos.y = (pIVar20->DC).CursorPosPrevLine.y;
        (pIVar20->DC).CurrLineSize = (pIVar20->DC).PrevLineSize;
        (pIVar20->DC).CurrLineTextBaseOffset = (pIVar20->DC).PrevLineTextBaseOffset;
      }
      bVar14 = SmallButton("Save to memory");
      if (bVar14) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      if (pIVar20->SkipItems == false) {
        (pIVar20->DC).CursorPos.x =
             (pIVar13->Style).ItemSpacing.x + (pIVar20->DC).CursorPosPrevLine.x;
        (pIVar20->DC).CursorPos.y = (pIVar20->DC).CursorPosPrevLine.y;
        (pIVar20->DC).CurrLineSize = (pIVar20->DC).PrevLineSize;
        (pIVar20->DC).CurrLineTextBaseOffset = (pIVar20->DC).PrevLineTextBaseOffset;
      }
      bVar14 = SmallButton("Save to disk");
      if (bVar14) {
        SaveIniSettingsToDisk((pIVar12->IO).IniFilename);
      }
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      if (pIVar20->SkipItems == false) {
        (pIVar20->DC).CursorPos.x =
             (pIVar13->Style).ItemSpacing.x + (pIVar20->DC).CursorPosPrevLine.x;
        (pIVar20->DC).CursorPos.y = (pIVar20->DC).CursorPosPrevLine.y;
        (pIVar20->DC).CurrLineSize = (pIVar20->DC).PrevLineSize;
        (pIVar20->DC).CurrLineTextBaseOffset = (pIVar20->DC).PrevLineTextBaseOffset;
      }
      if ((pIVar12->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar12->SettingsDirtyTimer,0));
      bVar14 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                        (ulong)(uint)(pIVar12->SettingsHandlers).Size);
      if (bVar14) {
        if (0 < (pIVar12->SettingsHandlers).Size) {
          lVar18 = 0;
          lVar19 = 0;
          do {
            BulletText("%s",*(undefined8 *)
                             ((long)&((pIVar12->SettingsHandlers).Data)->TypeName + lVar18));
            lVar19 = lVar19 + 1;
            lVar18 = lVar18 + 0x48;
          } while (lVar19 < (pIVar12->SettingsHandlers).Size);
        }
        TreePop();
      }
      bVar14 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                        (ulong)(uint)(pIVar12->SettingsWindows).Buf.Size);
      if (bVar14) {
        pcVar23 = (pIVar12->SettingsWindows).Buf.Data;
        if (pcVar23 != (char *)0x0) {
          puVar35 = (uint *)(pcVar23 + 4);
          do {
            Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)*puVar35,puVar35 + 4,
                 (ulong)(uint)(int)(short)puVar35[1],(ulong)(uint)(int)*(short *)((long)puVar35 + 6)
                 ,(ulong)(uint)(int)(short)puVar35[2],
                 (ulong)(uint)(int)*(short *)((long)puVar35 + 10),(ulong)(byte)puVar35[3]);
            puVar35 = (uint *)((long)puVar35 + (long)(int)puVar35[-1]);
          } while (puVar35 !=
                   (uint *)((pIVar12->SettingsWindows).Buf.Data +
                           (long)(pIVar12->SettingsWindows).Buf.Size + 4));
        }
        TreePop();
      }
      bVar14 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                        (ulong)(uint)(pIVar12->SettingsTables).Buf.Size);
      if (bVar14) {
        pcVar23 = (pIVar12->SettingsTables).Buf.Data;
        if (pcVar23 != (char *)0x0) {
          settings = (ImGuiTableSettings *)(pcVar23 + 4);
          do {
            DebugNodeTableSettings(settings);
            iVar15._0_1_ = settings[-1].ColumnsCount;
            iVar15._1_1_ = settings[-1].ColumnsCountMax;
            iVar15._2_1_ = settings[-1].WantApply;
            iVar15._3_1_ = settings[-1].field_0xf;
            settings = (ImGuiTableSettings *)((long)&settings->ID + (long)iVar15);
          } while (settings !=
                   (ImGuiTableSettings *)
                   ((pIVar12->SettingsTables).Buf.Data +
                   (long)(pIVar12->SettingsTables).Buf.Size + 4));
        }
        TreePop();
      }
      iVar15 = (pIVar12->SettingsIniData).Buf.Size;
      uVar29 = (ulong)(iVar15 - 1);
      if (iVar15 == 0) {
        uVar29 = 0;
      }
      bVar14 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar29);
      if (bVar14) {
        pcVar23 = (pIVar12->SettingsIniData).Buf.Data;
        pcVar21 = ImGuiTextBuffer::EmptyString;
        if (pcVar23 != (char *)0x0) {
          pcVar21 = pcVar23;
        }
        buf._4_4_ = GImGui->FontSize * 20.0;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = -0x80;
        buf[3] = -0x80;
        InputTextMultiline("##Ini",pcVar21,(long)(pIVar12->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                           0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar14 = TreeNode("Internal state");
    if (bVar14) {
      Text("WINDOWING");
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      fVar37 = (pIVar13->Style).IndentSpacing + (pIVar20->DC).Indent.x;
      (pIVar20->DC).Indent.x = fVar37;
      (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      pcVar21 = "NULL";
      pcVar23 = "NULL";
      if (pIVar12->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar23 = pIVar12->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar23);
      pcVar23 = "NULL";
      if (pIVar12->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar23 = pIVar12->HoveredWindow->RootWindow->Name;
      }
      Text("HoveredWindow->Root: \'%s\'",pcVar23);
      pcVar23 = "NULL";
      if (pIVar12->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar23 = pIVar12->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar23);
      pcVar23 = "NULL";
      if (pIVar12->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar23 = pIVar12->MovingWindow->Name;
      }
      iVar15 = 0;
      Text("MovingWindow: \'%s\'",pcVar23);
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      fVar37 = (pIVar20->DC).Indent.x - (pIVar13->Style).IndentSpacing;
      (pIVar20->DC).Indent.x = fVar37;
      (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      Text("ITEMS");
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      fVar37 = (pIVar13->Style).IndentSpacing + (pIVar20->DC).Indent.x;
      (pIVar20->DC).Indent.x = fVar37;
      (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar12->ActiveIdTimer,0),(ulong)pIVar12->ActiveId,
           (ulong)pIVar12->ActiveIdPreviousFrame,(ulong)pIVar12->ActiveIdAllowOverlap,
           (&PTR_anon_var_dwarf_1d738_0017aa40)[pIVar12->ActiveIdSource]);
      if (pIVar12->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar12->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar21);
      uVar29 = 0;
      do {
        uVar29 = (ulong)((int)uVar29 +
                        (uint)(((pIVar12->ActiveIdUsingKeyInputMask).Storage[iVar15 >> 5] >>
                                (iVar15 + 0x200U & 0x1f) & 1) != 0));
        iVar15 = iVar15 + 1;
      } while (iVar15 != 0x85);
      Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)",
           (ulong)pIVar12->ActiveIdUsingMouseWheel,(ulong)pIVar12->ActiveIdUsingNavDirMask,
           (ulong)pIVar12->ActiveIdUsingNavInputMask,uVar29);
      Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d",SUB84((double)pIVar12->HoveredIdTimer,0)
           ,(ulong)pIVar12->HoveredIdPreviousFrame,(ulong)pIVar12->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar12->DragDropActive,(ulong)(pIVar12->DragDropPayload).SourceId,
           (pIVar12->DragDropPayload).DataType,(ulong)(uint)(pIVar12->DragDropPayload).DataSize);
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      fVar37 = (pIVar20->DC).Indent.x - (pIVar13->Style).IndentSpacing;
      (pIVar20->DC).Indent.x = fVar37;
      (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      Text("NAV,FOCUS");
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      fVar37 = (pIVar13->Style).IndentSpacing + (pIVar20->DC).Indent.x;
      (pIVar20->DC).Indent.x = fVar37;
      (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      pcVar21 = "NULL";
      pcVar23 = "NULL";
      if (pIVar12->NavWindow != (ImGuiWindow *)0x0) {
        pcVar23 = pIVar12->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar23);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar12->NavId,(ulong)pIVar12->NavLayer);
      Text("NavInputSource: %s",(&PTR_anon_var_dwarf_1d738_0017aa40)[pIVar12->NavInputSource]);
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar12->IO).NavActive,
           (ulong)(pIVar12->IO).NavVisible);
      Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X",
           (ulong)pIVar12->NavActivateId,(ulong)pIVar12->NavActivateDownId,
           (ulong)pIVar12->NavActivatePressedId);
      Text("NavActivateFlags: %04X",(ulong)(uint)pIVar12->NavActivateFlags);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar12->NavDisableHighlight,
           (ulong)pIVar12->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar12->NavFocusScopeId);
      if (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar21 = pIVar12->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar21);
      pIVar13 = GImGui;
      pIVar20 = GImGui->CurrentWindow;
      pIVar20->WriteAccessed = true;
      fVar37 = (pIVar20->DC).Indent.x - (pIVar13->Style).IndentSpacing;
      (pIVar20->DC).Indent.x = fVar37;
      (pIVar20->DC).CursorPos.x = fVar37 + (pIVar20->Pos).x + (pIVar20->DC).ColumnsOffset.x;
      TreePop();
    }
    if ((((pIVar12->DebugMetricsConfig).ShowWindowsRects != false) ||
        ((pIVar12->DebugMetricsConfig).ShowWindowsBeginOrder == true)) &&
       (0 < *(int *)local_1a8._0_8_)) {
      lVar18 = 0;
      do {
        pIVar20 = (pIVar12->Windows).Data[lVar18];
        if (pIVar20->WasActive == true) {
          pIVar16 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
          if ((pIVar12->DebugMetricsConfig).ShowWindowsRects == true) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetWindowRect(pIVar20,*local_198);
            ImDrawList::AddRect(pIVar16,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
          }
          if (((pIVar12->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
             ((pIVar20->Flags & 0x1000000) == 0)) {
            ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar20->BeginOrderWithinContext);
            local_1b8.y = GImGui->FontSize + (pIVar20->Pos).y;
            local_1b8.x = GImGui->FontSize + (pIVar20->Pos).x;
            ImDrawList::AddRectFilled(pIVar16,&pIVar20->Pos,&local_1b8,0xff6464c8,0.0,0);
            ImDrawList::AddText(pIVar16,&pIVar20->Pos,0xffffffff,buf,(char *)0x0);
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < *(int *)local_1a8._0_8_);
    }
    if (((pIVar12->DebugMetricsConfig).ShowTablesRects == true) &&
       (0 < (pIVar12->Tables).Map.Data.Size)) {
      lVar18 = 0;
      do {
        pIVar24 = (pIVar12->Tables).Buf.Data;
        lVar19 = (long)(pIVar12->Tables).Map.Data.Data[lVar18].field_1.val_i;
        if ((pIVar24 != (ImGuiTable *)0x0 && lVar19 != -1) &&
           (pIVar24 = pIVar24 + lVar19, pIVar12->FrameCount + -1 <= pIVar24->LastFrameActive)) {
          pIVar16 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
          if (*local_1b0 < 6) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetTableRect(pIVar24,*local_1b0,-1);
            ImDrawList::AddRect(pIVar16,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
          }
          else if (0 < pIVar24->ColumnsCount) {
            iVar15 = 0;
            do {
              buf._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar24,*local_1b0,iVar15);
              bVar14 = iVar15 == pIVar24->HoveredColumnBody;
              col = 0xff8000ff;
              if (bVar14) {
                col = 0xff80ffff;
              }
              ImDrawList::AddRect(pIVar16,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,0,
                                  *(float *)(&DAT_00160248 + (ulong)bVar14 * 4));
              iVar15 = iVar15 + 1;
            } while (iVar15 < pIVar24->ColumnsCount);
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < (pIVar12->Tables).Map.Data.Size);
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    if (cfg->ShowStackTool)
        ShowStackToolWindow(&cfg->ShowStackTool);

    if (!Begin("Dear ImGui Metrics/Debugger", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d visible windows, %d active allocations", io.MetricsRenderWindows, io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // Stack Tool is your best friend!
        Checkbox("Show stack tool", &cfg->ShowStackTool);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetMapData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        TreePop();
    }

    // Windows
    if (TreeNode("Windows", "Windows (%d)", g.Windows.Size))
    {
        //SetNextItemOpen(true, ImGuiCond_Once);
        DebugNodeWindowsList(&g.Windows, "By display order");
        DebugNodeWindowsList(&g.WindowsFocusOrder, "By focus order (root windows)");
        if (TreeNode("By submission order (begin stack)"))
        {
            // Here we display windows in their submitted order/hierarchy, however note that the Begin stack doesn't constitute a Parent<>Child relationship!
            ImVector<ImGuiWindow*>& temp_buffer = g.WindowsTempSortBuffer;
            temp_buffer.resize(0);
            for (int i = 0; i < g.Windows.Size; i++)
                if (g.Windows[i]->LastFrameActive + 1 >= g.FrameCount)
                    temp_buffer.push_back(g.Windows[i]);
            struct Func { static int IMGUI_CDECL WindowComparerByBeginOrder(const void* lhs, const void* rhs) { return ((int)(*(const ImGuiWindow* const *)lhs)->BeginOrderWithinContext - (*(const ImGuiWindow* const*)rhs)->BeginOrderWithinContext); } };
            ImQsort(temp_buffer.Data, (size_t)temp_buffer.Size, sizeof(ImGuiWindow*), Func::WindowComparerByBeginOrder);
            DebugNodeWindowsListByBeginStackParent(temp_buffer.Data, temp_buffer.Size, NULL);
            TreePop();
        }

        TreePop();
    }

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetMapSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetMapData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetMapSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetMapData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
#ifndef IMGUI_DISABLE_DEMO_WINDOWS
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }
#endif

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, GetInputSourceName(g.ActiveIdSource));
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");

        int active_id_using_key_input_count = 0;
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            active_id_using_key_input_count += g.ActiveIdUsingKeyInputMask[n] ? 1 : 0;
        Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)", g.ActiveIdUsingMouseWheel, g.ActiveIdUsingNavDirMask, g.ActiveIdUsingNavInputMask, active_id_using_key_input_count);
        Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Not displaying g.HoveredId as it is update mid-frame
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", GetInputSourceName(g.NavInputSource));
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X", g.NavActivateId, g.NavActivateDownId, g.NavActivatePressedId, g.NavActivateInputId);
        Text("NavActivateFlags: %04X", g.NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetMapData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}